

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XprHelper.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>,-1,1,true>,-1,1,false>const,-1,1,false>const>>,3,0>
       ::
       run<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>,_1,1,true>,_1,1,false>const,_1,1,false>const>>
                 (redux_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
                  *eval,scalar_sum_op<float,_float> *func,
                 CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
                 *xpr)

{
  float *pfVar1;
  float *pfVar2;
  long lVar3;
  float *pfVar4;
  Index index;
  long lVar5;
  long lVar6;
  long lVar7;
  Scalar SVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  
  lVar3 = (xpr->m_xpr).
          super_BlockImpl<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false,_Eigen::Dense>
          .
          super_BlockImpl_dense<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
          .
          super_MapBase<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>,_0>
          .m_rows.m_value;
  lVar5 = 8;
  pfVar4 = (eval->
           super_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>_>
           ).
           super_unary_evaluator<Eigen::CwiseUnaryOp<Eigen::internal::scalar_abs2_op<float>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>,_Eigen::internal::IndexBased,_float>
           .m_d.argImpl.
           super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>_>
           .
           super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false,_true>
           .
           super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,__1,_1,_false>,__1,_1,_false>,_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>
           .m_data;
  if (lVar3 + 3U < 7) {
    SVar8 = *pfVar4 * *pfVar4;
    for (lVar5 = 1; lVar5 < lVar3; lVar5 = lVar5 + 1) {
      SVar8 = SVar8 + pfVar4[lVar5] * pfVar4[lVar5];
    }
  }
  else {
    lVar6 = (lVar3 / 4) * 4;
    fVar9 = *pfVar4 * *pfVar4;
    fVar10 = pfVar4[1] * pfVar4[1];
    fVar11 = pfVar4[2] * pfVar4[2];
    fVar12 = pfVar4[3] * pfVar4[3];
    if (7 < lVar3) {
      lVar7 = (lVar3 / 8) * 8;
      fVar13 = pfVar4[4] * pfVar4[4];
      fVar14 = pfVar4[5] * pfVar4[5];
      fVar15 = pfVar4[6] * pfVar4[6];
      fVar16 = pfVar4[7] * pfVar4[7];
      for (; lVar5 < lVar7; lVar5 = lVar5 + 8) {
        pfVar1 = pfVar4 + lVar5;
        pfVar2 = pfVar4 + lVar5 + 4;
        fVar9 = fVar9 + *pfVar1 * *pfVar1;
        fVar10 = fVar10 + pfVar1[1] * pfVar1[1];
        fVar11 = fVar11 + pfVar1[2] * pfVar1[2];
        fVar12 = fVar12 + pfVar1[3] * pfVar1[3];
        fVar13 = fVar13 + *pfVar2 * *pfVar2;
        fVar14 = fVar14 + pfVar2[1] * pfVar2[1];
        fVar15 = fVar15 + pfVar2[2] * pfVar2[2];
        fVar16 = fVar16 + pfVar2[3] * pfVar2[3];
      }
      fVar9 = fVar9 + fVar13;
      fVar10 = fVar10 + fVar14;
      fVar11 = fVar11 + fVar15;
      fVar12 = fVar12 + fVar16;
      if (lVar7 < lVar6) {
        pfVar1 = pfVar4 + (lVar3 / 8) * 8;
        fVar9 = fVar9 + *pfVar1 * *pfVar1;
        fVar10 = fVar10 + pfVar1[1] * pfVar1[1];
        fVar11 = fVar11 + pfVar1[2] * pfVar1[2];
        fVar12 = fVar12 + pfVar1[3] * pfVar1[3];
      }
    }
    SVar8 = fVar12 + fVar10 + fVar11 + fVar9;
    for (; lVar6 < lVar3; lVar6 = lVar6 + 1) {
      SVar8 = SVar8 + pfVar4[lVar6] * pfVar4[lVar6];
    }
  }
  return SVar8;
}

Assistant:

explicit variable_if_dynamic(T value = 0) EIGEN_NO_THROW : m_value(value) {}